

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

bool vkt::SpirVAssembly::anon_unknown_5::compareFUnord
               (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                *inputs,vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                        *outputAllocs,
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *expectedOutputs,TestLog *log)

{
  pointer pSVar1;
  int iVar2;
  undefined4 extraout_var;
  float *value_00;
  float *value_01;
  undefined4 extraout_var_02;
  MessageBuilder *pMVar3;
  bool bVar4;
  ulong uVar5;
  int *value_02;
  MessageBuilder local_1b0;
  int *value;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if ((long)(outputAllocs->
            super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(outputAllocs->
            super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x10) {
    pSVar1 = (expectedOutputs->
             super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar2 = (*pSVar1->m_ptr->_vptr_BufferInterface[3])();
    value = (int *)CONCAT44(extraout_var,iVar2);
    value_02 = (int *)((outputAllocs->
                       super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->m_ptr->m_hostPtr;
    iVar2 = (*((inputs->
               super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->m_ptr->_vptr_BufferInterface[3])();
    value_00 = (float *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*((inputs->
               super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               )._M_impl.super__Vector_impl_data._M_start[1].m_ptr)->_vptr_BufferInterface[3])();
    value_01 = (float *)CONCAT44(extraout_var_01,iVar2);
    bVar4 = true;
    uVar5 = 0;
    while( true ) {
      iVar2 = (*pSVar1->m_ptr->_vptr_BufferInterface[2])();
      if (CONCAT44(extraout_var_02,iVar2) >> 2 <= uVar5) break;
      if (*value_02 != *value) {
        local_1b0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
        std::operator<<((ostream *)&local_1b0.m_str,"ERROR: Sub-case failed. inputs: ");
        pMVar3 = tcu::MessageBuilder::operator<<(&local_1b0,value_00);
        std::operator<<((ostream *)&pMVar3->m_str,",");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,value_01);
        std::operator<<((ostream *)&pMVar3->m_str," output: ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,value_02);
        std::operator<<((ostream *)&pMVar3->m_str," expected output: ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,value);
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
        bVar4 = false;
      }
      uVar5 = uVar5 + 1;
      value_02 = value_02 + 1;
      value = value + 1;
      value_00 = value_00 + 1;
      value_01 = value_01 + 1;
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool compareFUnord (const std::vector<BufferSp>& inputs, const vector<AllocationSp>& outputAllocs, const std::vector<BufferSp>& expectedOutputs, TestLog& log)
{
	if (outputAllocs.size() != 1)
		return false;

	const BufferSp&	expectedOutput			= expectedOutputs[0];
	const deInt32*	expectedOutputAsInt		= static_cast<const deInt32*>(expectedOutputs[0]->data());
	const deInt32*	outputAsInt				= static_cast<const deInt32*>(outputAllocs[0]->getHostPtr());
	const float*	input1AsFloat			= static_cast<const float*>(inputs[0]->data());
	const float*	input2AsFloat			= static_cast<const float*>(inputs[1]->data());
	bool returnValue						= true;

	for (size_t idx = 0; idx < expectedOutput->getNumBytes() / sizeof(deInt32); ++idx)
	{
		if (outputAsInt[idx] != expectedOutputAsInt[idx])
		{
			log << TestLog::Message << "ERROR: Sub-case failed. inputs: " << input1AsFloat[idx] << "," << input2AsFloat[idx] << " output: " << outputAsInt[idx]<< " expected output: " << expectedOutputAsInt[idx] << TestLog::EndMessage;
			returnValue = false;
		}
	}
	return returnValue;
}